

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_analysis.cc
# Opt level: O3

void absl::lts_20250127::cord_internal::anon_unknown_0::
     AnalyzeBtree<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)2>
               (CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)2> rep,
               RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)2>
               *raw_usage)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  pair<std::__detail::_Node_iterator<const_absl::lts_20250127::cord_internal::CordRep_*,_true,_false>,_bool>
  pVar5;
  __node_gen_type __node_gen;
  
  pVar5 = std::
          _Hashtable<absl::lts_20250127::cord_internal::CordRep_const*,absl::lts_20250127::cord_internal::CordRep_const*,std::allocator<absl::lts_20250127::cord_internal::CordRep_const*>,std::__detail::_Identity,std::equal_to<absl::lts_20250127::cord_internal::CordRep_const*>,std::hash<absl::lts_20250127::cord_internal::CordRep_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<absl::lts_20250127::cord_internal::CordRep_const*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<absl::lts_20250127::cord_internal::CordRep_const*,false>>>>
                    ();
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    raw_usage->total = raw_usage->total + 0x40;
  }
  if ((rep.rep)->tag != '\x03') {
    __assert_fail("IsBtree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                  ,0x25c,"const CordRepBtree *absl::cord_internal::CordRep::btree() const");
  }
  bVar1 = (rep.rep)->storage[1];
  bVar2 = (rep.rep)->storage[2];
  if ((rep.rep)->storage[0] == '\0') {
    if (bVar1 != bVar2) {
      lVar4 = (ulong)bVar1 << 3;
      do {
        AnalyzeDataEdge<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)2>
                  (*(Nonnull<const_CordRep_*> *)(rep.rep[1].storage + lVar4 + -0xd),raw_usage);
        lVar4 = lVar4 + 8;
      } while ((ulong)bVar2 * 8 != lVar4);
    }
  }
  else if (bVar1 != bVar2) {
    uVar3 = (ulong)((uint)bVar1 * 8);
    do {
      AnalyzeBtree<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)2>
                (*(Nonnull<const_CordRep_*> *)(rep.rep[1].storage + (uVar3 - 0xd)),raw_usage);
      uVar3 = uVar3 + 8;
    } while ((ulong)bVar2 * 8 != uVar3);
  }
  return;
}

Assistant:

void AnalyzeBtree(CordRepRef<mode> rep, RawUsage<mode>& raw_usage) {
  raw_usage.Add(sizeof(CordRepBtree), rep);
  const CordRepBtree* tree = rep.rep->btree();
  if (tree->height() > 0) {
    for (CordRep* edge : tree->Edges()) {
      AnalyzeBtree(rep.Child(edge), raw_usage);
    }
  } else {
    for (CordRep* edge : tree->Edges()) {
      AnalyzeDataEdge(rep.Child(edge), raw_usage);
    }
  }
}